

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::DebuggerScope::GetPropertyIndex(DebuggerScope *this,PropertyId propertyId,int *index)

{
  anon_class_16_2_b1c2d40d map;
  bool bVar1;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  bool found;
  int *index_local;
  DebuggerScope *pDStack_18;
  PropertyId propertyId_local;
  DebuggerScope *this_local;
  
  index_local._4_4_ = propertyId;
  pDStack_18 = this;
  bVar1 = HasProperties(this);
  if (bVar1) {
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
              ::operator->(&this->scopeProperties);
    map.index = index;
    map.propertyId = (PropertyId *)((long)&index_local + 4);
    bVar1 = JsUtil::
            List<Js::DebuggerScopeProperty,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
            ::MapUntil<Js::DebuggerScope::GetPropertyIndex(int,int&)::__0>
                      ((List<Js::DebuggerScopeProperty,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                        *)this_00,map);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    *index = -1;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DebuggerScope::GetPropertyIndex(Js::PropertyId propertyId, int& index)
    {
        if (!this->HasProperties())
        {
            index = -1;
            return false;
        }

        bool found = this->scopeProperties->MapUntil( [&](int i, const DebuggerScopeProperty& scopeProperty) {
            if(scopeProperty.propId == propertyId)
            {
                index = scopeProperty.location;
                return true;
            }
            return false;
        });

        if(!found)
        {
            return false;
        }
        return true;
    }